

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

bool __thiscall
GlobOpt::FinishOptPropOp
          (GlobOpt *this,Instr *instr,PropertySymOpnd *opnd,BasicBlock *block,
          bool updateExistingValue,bool *emitsTypeCheckOut,bool *changesTypeValueOut)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOLEAN BVar5;
  StackSym *pSVar6;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  undefined4 *puVar7;
  SymID i;
  BasicBlock *local_40;
  bool local_31 [8];
  bool isObjTypeChecked;
  
  bVar3 = DoObjTypeSpec(this);
  if ((!bVar3) || (bVar3 = OpCodeAttr::FastFldInstr(instr->m_opcode), !bVar3)) {
    return false;
  }
  bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(opnd);
  local_31[0] = false;
  if (bVar3) {
    bVar3 = ProcessPropOpInTypeCheckSeq<true>
                      (this,instr,opnd,block,updateExistingValue,emitsTypeCheckOut,
                       changesTypeValueOut,local_31);
  }
  else {
    bVar3 = false;
  }
  if ((PropertySymOpnd *)instr->m_dst != opnd) {
    return bVar3;
  }
  if (this->objectTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    return bVar3;
  }
  local_40 = block;
  if (block == (BasicBlock *)0x0) {
    local_40 = this->currentBlock;
  }
  bVar4 = IR::PropertySymOpnd::HasObjectTypeSym(opnd);
  if (bVar4) {
    pSVar6 = IR::PropertySymOpnd::GetObjectTypeSym(opnd);
    i = (pSVar6->super_Sym).m_id;
  }
  else {
    i = 0xffffffff;
  }
  if ((bVar3 == false) || (bVar4 = IR::PropertySymOpnd::IsBeingAdded(opnd), bVar4)) {
    this_00 = (local_40->globOptData).maybeWrittenTypeSyms;
    if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
      pJVar1 = this->alloc;
      this_00->head = (Type_conflict)0x0;
      this_00->lastFoundIndex = (Type_conflict)0x0;
      this_00->alloc = pJVar1;
      this_00->lastUsedNodePrevNextField = (Type)this_00;
      (local_40->globOptData).maybeWrittenTypeSyms = this_00;
    }
    if (bVar3 == false) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this_00,this->objectTypeSyms);
      goto LAB_0046bf28;
    }
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test(this->objectTypeSyms,i);
    if (BVar5 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x39f,"(this->objectTypeSyms->Test(opndId))",
                         "this->objectTypeSyms->Test(opndId)");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear(this->objectTypeSyms,i);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              ((local_40->globOptData).maybeWrittenTypeSyms,this->objectTypeSyms);
    BVSparse<Memory::JitArenaAllocator>::Set(this->objectTypeSyms,i);
  }
  bVar4 = IR::PropertySymOpnd::ChangesObjectLayout(opnd);
  if (!bVar4) {
    if (local_31[0] != false) {
      return bVar3;
    }
    bVar4 = HasLiveObjectHeaderInlinedTypeSym(this,local_40,false,i);
    if (!bVar4) {
      return bVar3;
    }
    IR::PropertySymOpnd::SetTypeCheckRequired(opnd,true);
    return bVar3;
  }
LAB_0046bf28:
  KillObjectHeaderInlinedTypeSyms(this,local_40,bVar3,i);
  KillAuxSlotPtrSyms(this,opnd,local_40,bVar3);
  return bVar3;
}

Assistant:

bool
GlobOpt::FinishOptPropOp(IR::Instr *instr, IR::PropertySymOpnd *opnd, BasicBlock* block, bool updateExistingValue, bool* emitsTypeCheckOut, bool* changesTypeValueOut)
{
    if (!DoFieldRefOpts() || !OpCodeAttr::FastFldInstr(instr->m_opcode))
    {
        return false;
    }

    bool isTypeCheckSeqCandidate = opnd->IsTypeCheckSeqCandidate();
    bool isObjTypeSpecialized = false;
    bool isObjTypeChecked = false;

    if (isTypeCheckSeqCandidate)
    {
        isObjTypeSpecialized = ProcessPropOpInTypeCheckSeq<true>(instr, opnd, block, updateExistingValue, emitsTypeCheckOut, changesTypeValueOut, &isObjTypeChecked);
    }

    if (opnd == instr->GetDst() && this->objectTypeSyms)
    {
        if (block == nullptr)
        {
            block = this->currentBlock;
        }

        // This is a property store that may change the layout of the object that it stores to. This means that
        // it may change any aliased object. Do two things to address this:
        // - Add all object types in this function to the set that may have had a property added. This will prevent
        //   final type optimization across this instruction. (Only needed here for non-specialized stores.)
        // - Kill all type symbols that currently hold object-header-inlined types. Any of them may have their layout
        //   changed by the addition of a property.

        SymID opndId = opnd->HasObjectTypeSym() ? opnd->GetObjectTypeSym()->m_id : -1;

        if (!isObjTypeSpecialized || opnd->IsBeingAdded())
        {
            if (block->globOptData.maybeWrittenTypeSyms == nullptr)
            {
                block->globOptData.maybeWrittenTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
            }
            if (isObjTypeSpecialized)
            {
                // The current object will be protected by a type check, unless no further accesses to it are
                // protected by this access.
                Assert(this->objectTypeSyms->Test(opndId));
                this->objectTypeSyms->Clear(opndId);
            }
            block->globOptData.maybeWrittenTypeSyms->Or(this->objectTypeSyms);
            if (isObjTypeSpecialized)
            {
                this->objectTypeSyms->Set(opndId);
            }
        }

        if (!isObjTypeSpecialized || opnd->ChangesObjectLayout())
        {
            this->KillObjectHeaderInlinedTypeSyms(block, isObjTypeSpecialized, opndId);
            this->KillAuxSlotPtrSyms(opnd, block, isObjTypeSpecialized);
        }
        else if (!isObjTypeChecked && this->HasLiveObjectHeaderInlinedTypeSym(block, true, opndId))
        {
            opnd->SetTypeCheckRequired(true);
        }
    }

    return isObjTypeSpecialized;
}